

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cpp
# Opt level: O0

Type * __thiscall LiteScript::Type::ToString_abi_cxx11_(Type *this,Variable *param_1)

{
  Variable *param_1_local;
  Type *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)(param_1 + 1));
  return this;
}

Assistant:

std::string LiteScript::Type::ToString(const LiteScript::Variable&) const { return this->name; }